

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_optimizePureApplication
          (sysbvm_context_t *context,sysbvm_astFunctionApplicationNode_t **applicationNode)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  sysbvm_bitflags_t sVar4;
  sysbvm_astFunctionApplicationNode_t *psVar5;
  sysbvm_tuple_t tuple;
  size_t i;
  ulong uVar6;
  size_t i_1;
  ulong uVar7;
  anon_struct_40_5_99cd4f77 gcFrame;
  sysbvm_functionCallFrameStack_t callFrameStack;
  sysbvm_tuple_t local_148;
  sysbvm_context_t *psStack_140;
  sysbvm_tuple_t local_138;
  sysbvm_tuple_t sStack_130;
  undefined8 local_128;
  sysbvm_stackFrameRecord_t local_118;
  undefined8 local_108;
  undefined1 *local_100;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  anon_struct_136_2_7a050327_for_gcRoots *local_e0;
  sysbvm_functionCallFrameStack_t local_d8;
  
  local_100 = (undefined1 *)&local_148;
  local_138 = 0;
  sStack_130 = 0;
  local_148 = 0;
  psStack_140 = (sysbvm_context_t *)0x0;
  local_128 = 0;
  local_118.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_118._12_4_ = 0;
  local_108 = 5;
  sysbvm_stackFrame_pushRecord(&local_118);
  tuple = (*applicationNode)->functionExpression;
  _Var2 = sysbvm_astNode_isLiteralNode(context,tuple);
  if (_Var2) {
    psStack_140 = (sysbvm_context_t *)
                  sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
    sVar4 = sysbvm_function_getFlags(psStack_140,tuple);
    uVar3 = ((uint)sVar4 & 8) >> 3;
  }
  else {
    uVar3 = 0;
  }
  uVar7 = (*applicationNode)->arguments;
  if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
    uVar7 = (ulong)(*(uint *)(uVar7 + 0xc) >> 3);
  }
  else {
    uVar7 = 0;
  }
  for (uVar6 = 0; (uVar3 != 0 && (uVar6 < uVar7)); uVar6 = uVar6 + 1) {
    uVar1 = (*applicationNode)->arguments;
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_148 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8);
    }
    else {
      local_148 = 0;
    }
    _Var2 = sysbvm_astNode_isLiteralNode(context,local_148);
    uVar3 = (uint)_Var2;
  }
  if (uVar3 == 0) {
    sysbvm_stackFrame_popRecord(&local_118);
    psVar5 = *applicationNode;
  }
  else {
    memset(&local_d8,0,0xb0);
    local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_f8._12_4_ = 0;
    local_e8 = 0x11;
    local_e0 = &local_d8.gcRoots;
    sysbvm_stackFrame_pushRecord(&local_f8);
    uVar6 = (*applicationNode)->applicationFlags;
    if (uVar6 == 0 || (uVar6 & 0xf) != 0) {
      sVar4 = (long)uVar6 >> 4;
    }
    else {
      sVar4 = *(sysbvm_bitflags_t *)(uVar6 + 0x10);
    }
    sysbvm_functionCallFrameStack_begin(context,&local_d8,(sysbvm_tuple_t)psStack_140,uVar7,sVar4);
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = (*applicationNode)->arguments;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        local_148 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar6 * 8);
      }
      else {
        local_148 = 0;
      }
      sStack_130 = sysbvm_astLiteralNode_getValue(local_148);
      sysbvm_functionCallFrameStack_push(&local_d8,sStack_130);
    }
    sysbvm_stackFrame_popRecord(&local_f8);
    local_138 = sysbvm_functionCallFrameStack_finish(context,&local_d8);
    sysbvm_stackFrame_popRecord(&local_118);
    psVar5 = (sysbvm_astFunctionApplicationNode_t *)
             sysbvm_astLiteralNode_create
                       (context,((*applicationNode)->super).sourcePosition,local_138);
  }
  return (sysbvm_tuple_t)psVar5;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_optimizePureApplication(sysbvm_context_t *context, sysbvm_astFunctionApplicationNode_t **applicationNode)
{
    struct {
        sysbvm_tuple_t argumentNode;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    bool canOptimizeCall = false;
    if(sysbvm_astNode_isLiteralNode(context, (*applicationNode)->functionExpression))
    {
        gcFrame.literalFunction = sysbvm_astLiteralNode_getValue((*applicationNode)->functionExpression);
        canOptimizeCall = sysbvm_function_isPure(context, gcFrame.literalFunction);
    }

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    for(size_t i = 0; canOptimizeCall && i < applicationArgumentCount ; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        canOptimizeCall = canOptimizeCall && sysbvm_astNode_isLiteralNode(context, gcFrame.argumentNode);
    }

    if(!canOptimizeCall)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return (sysbvm_tuple_t)*applicationNode;
    }

    // Optimize pure function call
    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.literalFunction, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentValue = sysbvm_astLiteralNode_getValue(gcFrame.argumentNode);
        sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.argumentValue);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.pureCallResult = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astLiteralNode_create(context, (*applicationNode)->super.sourcePosition, gcFrame.pureCallResult);
}